

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
          (RepeatedPtrFieldBase *this)

{
  string *psVar1;
  string *psVar2;
  FileDescriptorProto *from;
  FileDescriptorProto *extraout_RAX;
  FileDescriptorProto *this_00;
  int iVar3;
  RepeatedPtrFieldBase *pRVar4;
  RepeatedPtrFieldBase *this_01;
  Arena *this_02;
  __base_type _Var5;
  atomic<long> aVar6;
  undefined1 auStack_98 [24];
  __atomic_base<long> _Stack_80;
  RepeatedPtrFieldBase RStack_70;
  RepeatedPtrFieldBase *pRStack_58;
  RepeatedPtrFieldBase RStack_48;
  atomic<google::protobuf::internal::StringBlock_*> aStack_30;
  
  iVar3 = this->current_size_;
  _Var5._M_p = (__pointer_type)(long)iVar3;
  if ((long)_Var5._M_p < 0) {
    aStack_30._M_b._M_p = (__base_type)(__pointer_type)0x23ac65;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)_Var5._M_p,0,"n >= 0");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    if (0 < iVar3) {
      ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                (this);
      return;
    }
    return;
  }
  pRVar4 = (RepeatedPtrFieldBase *)&stack0xffffffffffffffe0;
  aStack_30._M_b._M_p =
       (__base_type)
       Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
  ;
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
            ();
  iVar3 = (int)psVar2;
  RStack_48.arena_ = (Arena *)this;
  aStack_30._M_b._M_p = (__base_type)(__base_type)_Var5._M_p;
  if (iVar3 < 0) {
    pRStack_58 = (RepeatedPtrFieldBase *)0x23acc0;
    psVar1 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar3,0,"index >= 0");
  }
  else {
    psVar1 = (string *)0x0;
  }
  if (psVar1 == (string *)0x0) {
    if (iVar3 < pRVar4->current_size_) {
      psVar1 = (string *)0x0;
    }
    else {
      pRStack_58 = (RepeatedPtrFieldBase *)0x23acd1;
      psVar1 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)iVar3,(long)pRVar4->current_size_,"index < current_size_");
    }
    if (psVar1 == (string *)0x0) {
      pRStack_58 = (RepeatedPtrFieldBase *)0x23aca4;
      element_at(pRVar4,iVar3);
      return;
    }
  }
  else {
    pRStack_58 = (RepeatedPtrFieldBase *)0x23ace0;
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
              ();
  }
  this_01 = &RStack_48;
  pRStack_58 = (RepeatedPtrFieldBase *)0x23aced;
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>>
            ();
  iVar3 = this_01->current_size_;
  aVar6.super___atomic_base<long>._M_i = (__atomic_base<long>)(long)iVar3;
  RStack_70.arena_ = (Arena *)((ulong)psVar2 & 0xffffffff);
  pRStack_58 = pRVar4;
  if ((long)aVar6.super___atomic_base<long>._M_i < 0) {
    _Stack_80._M_i = 0x23ad35;
    psVar1 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)aVar6.super___atomic_base<long>._M_i,0,"n >= 0");
  }
  else {
    psVar1 = (string *)0x0;
  }
  if (psVar1 == (string *)0x0) {
    if (0 < iVar3) {
      ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                (this_01);
      return;
    }
    return;
  }
  pRVar4 = &RStack_70;
  _Stack_80._M_i =
       (__int_type_conflict1)
       Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
  ;
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
            ();
  iVar3 = (int)psVar1;
  auStack_98._16_8_ = this_01;
  _Stack_80._M_i = (__int_type_conflict1)aVar6.super___atomic_base<long>._M_i;
  if (iVar3 < 0) {
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar3,0,"index >= 0");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    if (iVar3 < pRVar4->current_size_) {
      from = (FileDescriptorProto *)0x0;
    }
    else {
      from = (FileDescriptorProto *)
             absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar3,(long)pRVar4->current_size_,"index < current_size_");
    }
    if (from == (FileDescriptorProto *)0x0) {
      element_at(pRVar4,iVar3);
      return;
    }
  }
  else {
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
              ();
    from = extraout_RAX;
  }
  this_02 = (Arena *)auStack_98;
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
            ();
  if (this_02 == (Arena *)0x0) {
    this_00 = (FileDescriptorProto *)operator_new(0xe0);
  }
  else {
    this_00 = (FileDescriptorProto *)Arena::Allocate(this_02,0xe0);
  }
  FileDescriptorProto::FileDescriptorProto(this_00,this_02,from);
  return;
}

Assistant:

void Clear() {
    const int n = current_size_;
    ABSL_DCHECK_GE(n, 0);
    if (n > 0) {
      using H = CommonHandler<TypeHandler>;
      ClearNonEmpty<H>();
    }
  }